

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion_handler.hpp
# Opt level: O2

void asio::detail::
     completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:1335:26),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  anon_class_80_4_80d670d3_for_handler_ handler;
  ptr local_80;
  anon_class_80_4_80d670d3_for_handler_ local_68;
  
  local_80.v = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1335:26),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)base;
  local_80.p = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1335:26),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)base;
  fineftp::FtpSession::
  writeDataToFile(std::shared_ptr<std::vector<char,std::allocator<char>>>,std::shared_ptr<fineftp::FtpSession::IoFile>,std::function<void()>)
  ::$_0::__0((__0 *)&local_68,(anon_class_80_4_80d670d3_for_handler_ *)(base + 1));
  local_80.h = &local_68;
  ptr::reset(&local_80);
  if (owner != (void *)0x0) {
    fineftp::std::function<void_()>::operator()(&local_68.fetch_more);
    std::ostream::write(&(local_68.file.
                          super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->field_0x10,
                        (long)((local_68.data.
                                super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                              super__Vector_impl_data._M_start);
  }
  fineftp::FtpSession::
  writeDataToFile(std::shared_ptr<std::vector<char,std::allocator<char>>>,std::shared_ptr<fineftp::FtpSession::IoFile>,std::function<void()>)
  ::$_0::~__0((__0 *)&local_68);
  ptr::~ptr(&local_80);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    completion_handler* h(static_cast<completion_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };

    ASIO_HANDLER_COMPLETION((*h));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        ASIO_MOVE_CAST2(handler_work<Handler, IoExecutor>)(
          h->work_));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(h->handler_));
    p.h = asio::detail::addressof(handler);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      w.complete(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }